

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

int http_snprintf(nng_http *conn,char *buf,size_t sz)

{
  nng_http_status nVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  undefined8 *item;
  char *pcVar5;
  long lVar6;
  anon_struct_16_2_3ef68a38 *paVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  nni_list *list;
  char *__s;
  char *pcVar12;
  bool bVar13;
  
  if (conn->client == true) {
    pcVar11 = conn->uri;
    if (pcVar11 == (char *)0x0) {
      pcVar12 = "/";
    }
    else {
      pcVar12 = "/";
      if (*pcVar11 != '\0') {
        pcVar12 = pcVar11;
      }
    }
    iVar2 = snprintf(buf,sz,"%s %s %s\r\n",conn->meth,pcVar12,conn->vers);
    lVar6 = 0x500;
  }
  else {
    nVar1 = conn->code;
    uVar4 = 200;
    if (nVar1 != 0) {
      uVar4 = (ulong)nVar1;
    }
    pcVar11 = conn->rsn;
    if (pcVar11 == (char *)0x0) {
      if (nVar1 == NNG_HTTP_STATUS_OK) {
        paVar7 = nni_http_reason::http_status;
      }
      else {
        pcVar11 = "Unknown HTTP Status";
        lVar6 = 0;
        do {
          lVar9 = lVar6;
          if (lVar9 + 0x10 == 0x3a0) goto LAB_0013a5f4;
          lVar6 = lVar9 + 0x10;
        } while (*(nng_http_status *)((long)&nni_http_reason::http_status[1].code + lVar9) != nVar1)
        ;
        paVar7 = (anon_struct_16_2_3ef68a38 *)(lVar9 + 0x15d530);
      }
      pcVar11 = paVar7->mesg;
    }
LAB_0013a5f4:
    iVar2 = snprintf(buf,sz,"%s %d %s\r\n",conn->vers,uVar4,pcVar11);
    lVar6 = 0x628;
  }
  list = (nni_list *)((long)&conn->sock + lVar6);
  uVar4 = (ulong)iVar2;
  pcVar12 = (char *)0x0;
  pcVar11 = (char *)(sz - uVar4);
  if (sz < uVar4) {
    pcVar11 = pcVar12;
  }
  pcVar10 = buf + uVar4;
  if (sz < uVar4 || (char *)(sz - uVar4) == (char *)0x0) {
    pcVar10 = pcVar12;
  }
  item = (undefined8 *)nni_list_first(list);
  if (item != (undefined8 *)0x0) {
    pcVar8 = pcVar11;
    if (pcVar10 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    pcVar12 = (char *)0x0;
    __s = pcVar10;
    do {
      iVar3 = snprintf(__s,(size_t)pcVar8,"%s: %s\r\n",*item,item[1]);
      pcVar5 = (char *)(long)iVar3;
      if (__s != (char *)0x0) {
        __s = __s + (long)pcVar5;
      }
      bVar13 = pcVar8 < pcVar5;
      pcVar8 = pcVar8 + -(long)pcVar5;
      if (bVar13) {
        pcVar8 = (char *)0x0;
      }
      pcVar12 = pcVar12 + (long)pcVar5;
      item = (undefined8 *)nni_list_next(list,item);
    } while (item != (undefined8 *)0x0);
  }
  pcVar8 = pcVar11 + -(long)pcVar12;
  if (pcVar11 < pcVar12) {
    pcVar8 = (char *)0x0;
  }
  pcVar10 = pcVar10 + (long)pcVar12;
  if (pcVar11 < pcVar12 || pcVar11 + -(long)pcVar12 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  iVar3 = snprintf(pcVar10,(size_t)pcVar8,"\r\n");
  return iVar3 + iVar2 + (int)pcVar12;
}

Assistant:

static int
http_snprintf(nng_http *conn, char *buf, size_t sz)
{
	size_t    len;
	size_t    n;
	nni_list *hdrs;

	if (conn->client) {
		len  = snprintf(buf, sz, "%s %s %s\r\n",
		     nni_http_get_method(conn), nni_http_get_uri(conn),
		     nni_http_get_version(conn));
		hdrs = &conn->req.data.hdrs;
	} else {
		len  = snprintf(buf, sz, "%s %d %s\r\n",
		     nni_http_get_version(conn), nni_http_get_status(conn),
		     nni_http_get_reason(conn));
		hdrs = &conn->res.data.hdrs;
	}

	if (len < sz) {
		sz -= len;
		buf += len;
	} else {
		sz  = 0;
		buf = NULL;
	}

	n = http_sprintf_headers(buf, sz, hdrs);
	len += n;
	if (n < sz) {
		sz -= n;
		buf += n;
	} else {
		sz  = 0;
		buf = NULL;
	}

	len += snprintf(buf, sz, "\r\n");
	return (len);
}